

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O0

void __thiscall
CombinedSeismogramm<float,_3>::AddValue
          (CombinedSeismogramm<float,_3> *this,float time,Elastic *elastic,IndexType detectorIndex)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  reference pvVar3;
  Sample local_2c;
  uint local_28;
  IndexType local_24;
  IndexType i;
  IndexType detectorIndex_local;
  Elastic *elastic_local;
  CombinedSeismogramm<float,_3> *pCStack_10;
  float time_local;
  CombinedSeismogramm<float,_3> *this_local;
  
  local_24 = detectorIndex;
  _i = elastic;
  elastic_local._4_4_ = time;
  pCStack_10 = this;
  std::vector<float,_std::allocator<float>_>::push_back
            (&this->times,(value_type_conflict *)((long)&elastic_local + 4));
  local_28 = 0;
  while( true ) {
    uVar1 = (ulong)local_28;
    sVar2 = std::
            vector<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
            ::size(&this->componentInfos);
    if (sVar2 <= uVar1) break;
    this_00 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::operator[]
                        (&this->seismogramms,(ulong)local_28);
    pvVar3 = std::
             vector<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
             ::operator[](&this->componentInfos,(ulong)local_28);
    (**pvVar3->getter->_vptr_ValueGetter)(pvVar3->getter,_i);
    Seismogramm<float>::AddValue(this_00,&local_2c,local_24);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::AddValue(Scalar time, const Elastic& elastic, IndexType detectorIndex)
{
    times.push_back(time);
    for (IndexType i = 0; i < componentInfos.size(); ++i)
    {
        seismogramms[i].AddValue(componentInfos[i].getter->GetValue(elastic), detectorIndex);
    }
}